

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O3

bool slang::svGlobMatchesInternal(string_view path,string_view pattern)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  short *psVar10;
  short *psVar11;
  string_view pattern_00;
  string_view pattern_01;
  string_view str;
  string_view path_00;
  char *local_38;
  
  pcVar6 = path._M_str;
  uVar3 = pattern._M_len;
  uVar5 = path._M_len;
  psVar11 = (short *)pattern._M_str;
  do {
    if (uVar3 == 0) {
      if (uVar5 == 0) {
        return true;
      }
      uVar3 = 0;
      do {
        if (pcVar6[uVar3] == '/') {
          return uVar5 - 1 == uVar3;
        }
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      return true;
    }
    if (uVar5 == 0) {
      return false;
    }
    if ((2 < uVar3) && ((char)psVar11[1] == '.' && *psVar11 == 0x2e2e)) {
      do {
        pattern_01._M_str = (char *)((long)psVar11 + 3);
        pattern_01._M_len = uVar3 - 3;
        path_00._M_str = pcVar6;
        path_00._M_len = uVar5;
        bVar1 = svGlobMatchesInternal(path_00,pattern_01);
        if (bVar1) {
          return true;
        }
        lVar4 = 1 - uVar5;
        pcVar7 = pcVar6;
        while (pcVar6 = pcVar7 + 1, *pcVar7 != '/') {
          lVar4 = lVar4 + 1;
          pcVar7 = pcVar6;
          if (lVar4 == 1) {
            return false;
          }
        }
        uVar5 = -lVar4;
      } while (lVar4 != 0);
      return bVar1;
    }
    uVar9 = 0;
    do {
      if (pcVar6[uVar9] == '/') {
        uVar2 = ~uVar9 + uVar5;
        local_38 = pcVar6 + uVar9 + 1;
        goto LAB_0021ec9d;
      }
      uVar9 = uVar9 + 1;
    } while (uVar5 != uVar9);
    uVar2 = 0;
    local_38 = (char *)0x0;
    uVar9 = uVar5;
LAB_0021ec9d:
    uVar5 = 0;
    do {
      if (*(char *)((long)psVar11 + uVar5) == '/') {
        uVar8 = ~uVar5 + uVar3;
        psVar10 = (short *)((long)psVar11 + uVar5 + 1);
        goto LAB_0021eccb;
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    uVar8 = 0;
    psVar10 = (short *)0x0;
    uVar5 = uVar3;
LAB_0021eccb:
    pattern_00._M_str = (char *)psVar11;
    pattern_00._M_len = uVar5;
    str._M_str = pcVar6;
    str._M_len = uVar9;
    bVar1 = matches(str,pattern_00);
    pcVar6 = local_38;
    uVar3 = uVar8;
    uVar5 = uVar2;
    psVar11 = psVar10;
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

static bool svGlobMatchesInternal(std::string_view path, std::string_view pattern) {
    while (!pattern.empty() && !path.empty()) {
        // Special case for recursive directory search.
        if (pattern.starts_with("..."sv)) {
            pattern = pattern.substr(3);
            do {
                if (svGlobMatchesInternal(path, pattern))
                    return true;

                nextSegment(path);
            } while (!path.empty());

            return false;
        }

        // If the next segments don't match then we don't match overall.
        if (!matches(nextSegment(path), nextSegment(pattern))) {
            return false;
        }
    }

    // We match if:
    // 1) we used up the whole pattern
    // 2) pattern ended in a separator and the next path segment is the last (i.e. the file name)
    //    -- OR --
    //    pattern didn't end in a separator and we matched the whole path (so it's empty now)
    nextSegment(path);
    return pattern.empty() && path.empty();
}